

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O2

int __thiscall
OSSLEDDSA::sign(OSSLEDDSA *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen
               )

{
  char cVar1;
  int iVar2;
  EVP_PKEY *pkey;
  long lVar3;
  uchar *puVar4;
  EVP_MD_CTX *ctx_00;
  uchar *puVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  size_t local_28;
  
  if ((int)tbs == 0x1a) {
    cVar1 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLEDPrivateKey::type);
    if (cVar1 == '\0') {
      pcVar8 = "Invalid key type supplied";
      iVar2 = 0x3e;
    }
    else {
      pkey = (EVP_PKEY *)OSSLEDPrivateKey::getOSSLKey((OSSLEDPrivateKey *)ctx);
      if (pkey == (EVP_PKEY *)0x0) {
        pcVar8 = "Could not get the OpenSSL private key";
        iVar2 = 0x48;
      }
      else {
        lVar3 = (**(code **)(*(long *)ctx + 0x40))(ctx);
        if (lVar3 != 0) {
          sVar6 = lVar3 * 2;
          local_28 = sVar6;
          ByteString::resize((ByteString *)siglen,sVar6);
          puVar4 = ByteString::operator[]((ByteString *)siglen,0);
          memset(puVar4,0,sVar6);
          ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
          iVar2 = EVP_DigestSignInit(ctx_00,(EVP_PKEY_CTX **)0x0,(EVP_MD *)0x0,(ENGINE *)0x0,pkey);
          if (iVar2 == 0) {
            uVar7 = ERR_get_error();
            pcVar8 = "EDDSA sign init failed (0x%08X)";
            iVar2 = 0x5a;
          }
          else {
            puVar4 = ByteString::operator[]((ByteString *)siglen,0);
            puVar5 = ByteString::const_byte_str((ByteString *)sig);
            sVar6 = ByteString::size((ByteString *)sig);
            iVar2 = EVP_DigestSign(ctx_00,puVar4,&local_28,puVar5,sVar6);
            if (iVar2 != 0) {
              EVP_MD_CTX_free(ctx_00);
              return (int)CONCAT71((int7)((ulong)sig >> 8),1);
            }
            uVar7 = ERR_get_error();
            pcVar8 = "EDDSA sign failed (0x%08X)";
            iVar2 = 0x60;
          }
          softHSMLog(3,"sign",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                     ,iVar2,pcVar8,uVar7);
          EVP_MD_CTX_free(ctx_00);
          return 0;
        }
        pcVar8 = "Could not get the order length";
        iVar2 = 0x51;
      }
    }
    softHSMLog(3,"sign",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
               ,iVar2,pcVar8);
  }
  else {
    softHSMLog(3,"sign",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
               ,0x37,"Invalid mechanism supplied (%i)",(ulong)tbs & 0xffffffff);
  }
  return 0;
}

Assistant:

bool OSSLEDDSA::sign(PrivateKey* privateKey, const ByteString& dataToSign,
		     ByteString& signature, const AsymMech::Type mechanism,
		     const void* /* param = NULL */, const size_t /* paramLen = 0 */)
{
	if (mechanism != AsymMech::EDDSA)
	{
		ERROR_MSG("Invalid mechanism supplied (%i)", mechanism);
		return false;
	}

	// Check if the private key is the right type
	if (!privateKey->isOfType(OSSLEDPrivateKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	OSSLEDPrivateKey* pk = (OSSLEDPrivateKey*) privateKey;
	EVP_PKEY* pkey = pk->getOSSLKey();

	if (pkey == NULL)
	{
		ERROR_MSG("Could not get the OpenSSL private key");

		return false;
	}

	// Perform the signature operation
	size_t len = pk->getOrderLength();
	if (len == 0)
	{
		ERROR_MSG("Could not get the order length");
		return false;
	}
	len *= 2;
	signature.resize(len);
	memset(&signature[0], 0, len);
	EVP_MD_CTX* ctx = EVP_MD_CTX_new();
	if (!EVP_DigestSignInit(ctx, NULL, NULL, NULL, pkey))
	{
		ERROR_MSG("EDDSA sign init failed (0x%08X)", ERR_get_error());
		EVP_MD_CTX_free(ctx);
		return false;
	}
	if (!EVP_DigestSign(ctx, &signature[0], &len, dataToSign.const_byte_str(), dataToSign.size()))
	{
		ERROR_MSG("EDDSA sign failed (0x%08X)", ERR_get_error());
		EVP_MD_CTX_free(ctx);
		return false;
	}
	EVP_MD_CTX_free(ctx);
	return true;
}